

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

void anon_unknown.dwarf_19b33::loadMonitor(Monitor *out,Value *v)

{
  int iVar1;
  Table *pTVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
  local_32;
  ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_31;
  
  pTVar2 = toml::Value::
           ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
           ::to(&local_32,v);
  p_Var3 = (pTVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(pTVar2->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      iVar1 = std::__cxx11::string::compare((char *)(p_Var3 + 1));
      if (iVar1 != 0) {
        throwInvalidKey((string *)(p_Var3 + 1));
        return;
      }
      toml::Value::
      ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::to(&local_31,(Value *)(p_Var3 + 2));
      std::__cxx11::string::_M_assign((string *)out);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

void loadMonitor(Config::Monitor& out, const toml::Value& v) {
  const auto& table = v.as<toml::Table>();
  for (const auto& it : table) {
    const auto& key = it.first;
    const auto& value = it.second;

    if (key == "statsd_address") {
      out.statsdAddress = value.as<std::string>();
      continue;
    }

    throwInvalidKey(key);
  }
}